

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall
crnlib::crn_comp::pack_color_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  undefined4 uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  uchar *puVar6;
  void *p;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  int iVar13;
  uint uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  uint uVar17;
  uint k;
  long lVar18;
  undefined4 *puVar19;
  long lVar20;
  symbol_codec *psVar21;
  static_huffman_data_model *this_00;
  bool bVar22;
  color_quad_u8 prev [2];
  vector<unsigned_int> residual_syms;
  symbol_histogram hist [2];
  vector<unsigned_int> remapped_endpoints;
  symbol_codec codec;
  undefined8 local_1a0;
  vector<unsigned_int> local_198;
  elemental_vector local_188;
  elemental_vector local_178;
  elemental_vector local_168;
  vector<unsigned_char> *local_158;
  crn_comp *local_150;
  ulong local_148;
  symbol_codec local_140;
  static_huffman_data_model local_a8 [2];
  
  uVar14 = (this->m_color_endpoints).m_size;
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  local_158 = packed_data;
  if (uVar14 != 0) {
    elemental_vector::increase_capacity(&local_168,uVar14,uVar14 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_168._8_8_ & 0xffffffff) * 4 + (long)local_168.m_p),0,
           (ulong)(uVar14 - local_168.m_size) << 2);
    local_168.m_size = uVar14;
  }
  if ((this->m_color_endpoints).m_size != 0) {
    puVar4 = (this->m_color_endpoints).m_p;
    puVar5 = remapping->m_p;
    uVar16 = 0;
    do {
      *(uint *)((long)local_168.m_p + (ulong)puVar5[uVar16] * 4) = puVar4[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->m_color_endpoints).m_size);
  }
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_178.m_p = (void *)0x0;
  local_178.m_size = 0;
  local_178.m_capacity = 0;
  elemental_vector::increase_capacity(&local_188,0x20,false,4,(object_mover)0x0,false);
  memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
         (ulong)(0x20 - local_188.m_size) << 2);
  local_188.m_size = 0x20;
  if (local_178.m_size != 0x40) {
    if (local_178.m_size < 0x41) {
      if (local_178.m_capacity < 0x40) {
        elemental_vector::increase_capacity
                  (&local_178,0x40,local_178.m_size == 0x3f,4,(object_mover)0x0,false);
      }
      memset((void *)((local_178._8_8_ & 0xffffffff) * 4 + (long)local_178.m_p),0,
             (ulong)(0x40 - local_178.m_size) << 2);
    }
    local_178.m_size = 0x40;
  }
  local_198.m_p = (uint *)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_198,(this->m_color_endpoints).m_size * 6);
  local_1a0 = 0;
  if ((this->m_color_endpoints).m_size != 0) {
    uVar16 = 0;
    local_150 = this;
    do {
      uVar2 = *(undefined4 *)((long)local_168.m_p + uVar16 * 4);
      dxt1_block::unpack_color((dxt1_block *)local_a8,(uint16)uVar2,false,0xff);
      uVar11 = local_a8[0].m_total_syms._3_1_;
      uVar7 = (undefined1)local_a8[0].m_total_syms;
      uVar9 = local_a8[0].m_total_syms._1_1_;
      local_140.m_pDecode_buf._0_1_ = (undefined1)local_a8[0].m_total_syms;
      local_140.m_pDecode_buf._1_1_ = local_a8[0].m_total_syms._1_1_;
      uVar10 = local_a8[0].m_total_syms._2_1_;
      local_140.m_pDecode_buf._2_1_ = local_a8[0].m_total_syms._2_1_;
      local_140.m_pDecode_buf._3_1_ = local_a8[0].m_total_syms._3_1_;
      local_148 = uVar16;
      dxt1_block::unpack_color((dxt1_block *)local_a8,(uint16)((uint)uVar2 >> 0x10),false,0xff);
      uVar12 = local_a8[0].m_total_syms._3_1_;
      uVar8 = (undefined1)local_a8[0].m_total_syms;
      local_140.m_pDecode_buf._4_1_ = (undefined1)local_a8[0].m_total_syms;
      local_140.m_pDecode_buf._5_2_ = local_a8[0].m_total_syms._1_2_;
      local_140.m_pDecode_buf._7_1_ = local_a8[0].m_total_syms._3_1_;
      puVar15 = &local_1a0;
      psVar21 = &local_140;
      puVar19 = &DAT_001abe20;
      lVar20 = 0;
      do {
        lVar18 = 0;
        do {
          uVar17 = (uint)*(byte *)((long)&psVar21->m_pDecode_buf + lVar18) -
                   (uint)*(byte *)((long)puVar15 + lVar18) & puVar19[lVar18];
          piVar1 = (int *)((long)(&local_188)[lVar18 == 1].m_p + (ulong)uVar17 * 4);
          *piVar1 = *piVar1 + 1;
          if (local_198.m_capacity <= local_198.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_198,local_198.m_size + 1,true,4,(object_mover)0x0,
                       false);
          }
          local_198.m_p[local_198.m_size] = uVar17;
          local_198.m_size = local_198.m_size + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        puVar19 = puVar19 + 3;
        psVar21 = (symbol_codec *)((long)&psVar21->m_pDecode_buf + 4);
        puVar15 = (undefined8 *)((long)puVar15 + 4);
        bVar22 = lVar20 == 0;
        lVar20 = lVar20 + 1;
      } while (bVar22);
      local_1a0 = CONCAT17(uVar12,CONCAT25(local_140.m_pDecode_buf._5_2_,
                                           CONCAT14(uVar8,CONCAT13(uVar11,CONCAT12(uVar10,CONCAT11(
                                                  uVar9,uVar7))))));
      uVar16 = local_148 + 1;
    } while (uVar16 < (local_150->m_color_endpoints).m_size);
  }
  lVar20 = 0;
  do {
    static_huffman_data_model::static_huffman_data_model
              ((static_huffman_data_model *)((long)&local_a8[0].m_total_syms + lVar20));
    lVar20 = lVar20 + 0x38;
  } while (lVar20 != 0x70);
  symbol_codec::symbol_codec(&local_140);
  symbol_codec::start_encoding(&local_140,0x100000);
  this_00 = local_a8;
  lVar20 = 0;
  bVar22 = false;
  do {
    iVar13 = static_huffman_data_model::init(this_00,(EVP_PKEY_CTX *)0x1);
    if (((char)iVar13 == '\0') ||
       (uVar14 = symbol_codec::encode_transmit_static_huffman_data_model
                           (&local_140,this_00,false,(static_huffman_data_model *)0x0), uVar14 == 0)
       ) goto LAB_0016439a;
    lVar20 = lVar20 + 0x10;
    this_00 = this_00 + 1;
    bVar22 = lVar20 != 0x10;
  } while (lVar20 == 0x10);
  if (local_198.m_size != 0) {
    iVar13 = 1;
    uVar16 = 0;
    do {
      symbol_codec::encode
                (&local_140,local_198.m_p[uVar16],
                 local_a8 + ((int)((uVar16 & 0xffffffff) / 3) * 3 + iVar13 == 0));
      uVar16 = uVar16 + 1;
      iVar13 = iVar13 + -1;
    } while (uVar16 < local_198.m_size);
  }
  symbol_codec::stop_encoding(&local_140,false);
  puVar6 = local_158->m_p;
  local_158->m_p = local_140.m_output_buf.m_p;
  uVar14 = local_158->m_size;
  local_158->m_size = local_140.m_output_buf.m_size;
  uVar3 = local_158->m_capacity;
  local_158->m_capacity = local_140.m_output_buf.m_capacity;
  local_140.m_output_buf.m_p = puVar6;
  local_140.m_output_buf.m_size = uVar14;
  local_140.m_output_buf.m_capacity = uVar3;
LAB_0016439a:
  if (local_140.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_140.m_output_syms.m_p);
  }
  if (local_140.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_140.m_arith_output_buf.m_p);
  }
  if (local_140.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_140.m_output_buf.m_p);
  }
  lVar20 = 0x38;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)&local_a8[0].m_total_syms + lVar20));
    lVar20 = lVar20 + -0x38;
  } while (lVar20 != -0x38);
  if (local_198.m_p != (uint *)0x0) {
    crnlib_free(local_198.m_p);
  }
  lVar20 = 0x20;
  do {
    p = *(void **)((long)&local_198.m_p + lVar20);
    if (p != (void *)0x0) {
      crnlib_free(p);
    }
    lVar20 = lVar20 + -0x10;
  } while (lVar20 != 0);
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  return bVar22;
}

Assistant:

bool crn_comp::pack_color_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_color_endpoints.size());

        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_color_endpoints[i];
        }

        const uint component_limits[6] = { 31, 63, 31, 31, 63, 31 };

        symbol_histogram hist[2];
        hist[0].resize(32);
        hist[1].resize(64);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_color_endpoints.size() * 2 * 3);

        color_quad_u8 prev[2];
        prev[0].clear();
        prev[1].clear();

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_color_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            color_quad_u8 cur[2];
            cur[0] = dxt1_block::unpack_color((uint16)(endpoint & 0xFFFF), false);
            cur[1] = dxt1_block::unpack_color((uint16)((endpoint >> 16) & 0xFFFF), false);

            for (uint j = 0; j < 2; j++)
            {
                for (uint k = 0; k < 3; k++)
                {
                    int delta = cur[j][k] - prev[j][k];
                    total_residuals += delta * delta;
                    int sym = delta & component_limits[j * 3 + k];
                    int table = (k == 1) ? 1 : 0;
                    hist[table].inc_freq(sym);
                    residual_syms.push_back(sym);
                }
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm[2];

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        for (uint i = 0; i < 2; i++)
        {
            if (!residual_dm[i].init(true, hist[i], 15))
            {
                return false;
            }

            if (!codec.encode_transmit_static_huffman_data_model(residual_dm[i], false))
            {
                return false;
            }
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            const uint table = ((i % 3) == 1) ? 1 : 0;
            codec.encode(sym, residual_dm[table]);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }